

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

FloatParts addsub_floats(FloatParts a,FloatParts b,_Bool subtract,float_status *s)

{
  FloatParts b_00;
  FloatParts b_01;
  FloatParts a_00;
  FloatParts a_01;
  undefined8 uVar1;
  _Bool _Var2;
  int iVar3;
  bool local_49;
  int shift;
  _Bool b_sign;
  _Bool a_sign;
  float_status *s_local;
  undefined4 uStack_38;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined2 uStack_32;
  _Bool subtract_local;
  FloatParts b_local;
  FloatParts a_local;
  undefined8 local_10;
  
  _uStack_38 = b.frac;
  b_local._8_8_ = a.frac;
  a_local.frac._0_4_ = a.exp;
  a_local.frac._4_1_ = a.cls;
  a_local.frac._5_1_ = a.sign;
  a_local.frac._6_2_ = a._14_2_;
  b_local.frac._0_4_ = b.exp;
  b_local.frac._4_1_ = b.cls;
  b_local.frac._5_1_ = b.sign;
  b_local.frac._6_2_ = b._14_2_;
  local_49 = (bool)(a_local.frac._5_1_ & 1);
  local_10._5_1_ = (_Bool)(b_local.frac._5_1_ & 1) != subtract;
  uVar1 = a._8_8_;
  if (local_49 == local_10._5_1_) {
    if ((a_local.frac._4_1_ == float_class_normal) && (b_local.frac._4_1_ == float_class_normal)) {
      if ((int)b_local.frac < (int)a_local.frac) {
        shift64RightJamming(_uStack_38,(int)a_local.frac - (int)b_local.frac,
                            (uint64_t *)&stack0xffffffffffffffc8);
      }
      else if ((int)a_local.frac < (int)b_local.frac) {
        shift64RightJamming(b_local._8_8_,(int)b_local.frac - (int)a_local.frac,
                            (uint64_t *)&b_local.exp);
        a_local.frac._0_4_ = (int)b_local.frac;
      }
      b_local._8_8_ = _uStack_38 + b_local._8_8_;
      if ((b_local._8_8_ & 0x8000000000000000) != 0) {
        shift64RightJamming(b_local._8_8_,1,(uint64_t *)&b_local.exp);
        a_local.frac._0_4_ = (int)a_local.frac + 1;
      }
      local_10._4_1_ = 2;
      local_10._0_4_ = (int)a_local.frac;
      local_10._5_1_ = a_local.frac._5_1_;
      local_10._6_2_ = a_local.frac._6_2_;
      a_local.exp = b_local.exp;
      a_local.cls = b_local.cls;
      a_local.sign = b_local.sign;
      a_local._14_2_ = b_local._14_2_;
    }
    else {
      _Var2 = is_nan(a_local.frac._4_1_);
      if ((_Var2) || (_Var2 = is_nan(b_local.frac._4_1_), _Var2)) {
        a_01.exp = (int)a_local.frac;
        a_01.frac._0_4_ = b_local.exp;
        a_01.frac._4_1_ = b_local.cls;
        a_01.frac._5_1_ = b_local.sign;
        a_01.frac._6_2_ = b_local._14_2_;
        a_01.cls = a_local.frac._4_1_;
        a_01.sign = a_local.frac._5_1_;
        a_01._14_2_ = a_local.frac._6_2_;
        b_01.exp = (int)b_local.frac;
        b_01.frac = _uStack_38;
        b_01.cls = b_local.frac._4_1_;
        b_01.sign = (_Bool)b_local.frac._5_1_;
        b_01._14_2_ = b_local.frac._6_2_;
        join_0x00000010_0x00000000_ = pick_nan(a_01,b_01,s);
      }
      else if ((a_local.frac._4_1_ == float_class_inf) || (b_local.frac._4_1_ == float_class_zero))
      {
        local_10._0_4_ = (int)uVar1;
        local_10._4_1_ = (char)((ulong)uVar1 >> 0x20);
        local_10._5_1_ = (bool)(char)((ulong)uVar1 >> 0x28);
        local_10._6_2_ = (short)((ulong)uVar1 >> 0x30);
        a_local.exp = b_local.exp;
        a_local.cls = b_local.cls;
        a_local.sign = b_local.sign;
        a_local._14_2_ = b_local._14_2_;
      }
      else {
        if ((b_local.frac._4_1_ != float_class_inf) && (a_local.frac._4_1_ != float_class_zero)) {
LAB_012b4c58:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                     ,0x428,(char *)0x0);
        }
        local_10._4_1_ = b_local.frac._4_1_;
        local_10._0_4_ = (int)b_local.frac;
        local_10._6_2_ = b_local.frac._6_2_;
        a_local.exp = uStack_38;
        a_local.cls = uStack_34;
        a_local.sign = (_Bool)uStack_33;
        a_local._14_2_ = uStack_32;
      }
    }
  }
  else if ((a_local.frac._4_1_ == float_class_normal) && (b_local.frac._4_1_ == float_class_normal))
  {
    if (((int)b_local.frac < (int)a_local.frac) ||
       (((int)a_local.frac == (int)b_local.frac && (_uStack_38 <= (ulong)b_local._8_8_)))) {
      shift64RightJamming(_uStack_38,(int)a_local.frac - (int)b_local.frac,
                          (uint64_t *)&stack0xffffffffffffffc8);
      b_local._8_8_ = b_local._8_8_ - _uStack_38;
    }
    else {
      shift64RightJamming(b_local._8_8_,(int)b_local.frac - (int)a_local.frac,
                          (uint64_t *)&b_local.exp);
      b_local._8_8_ = _uStack_38 - b_local._8_8_;
      a_local.frac._0_4_ = (int)b_local.frac;
      local_49 = local_49 != true;
    }
    if (b_local._8_8_ == 0) {
      a_local.frac._4_1_ = float_class_zero;
      a_local.frac._5_1_ = s->float_rounding_mode == '\x01';
    }
    else {
      iVar3 = clz64(b_local._8_8_);
      b_local._8_8_ = b_local._8_8_ << ((byte)(iVar3 + -1) & 0x3f);
      a_local.frac._0_4_ = (int)a_local.frac - (iVar3 + -1);
      a_local.frac._5_1_ = local_49;
    }
    local_10._4_1_ = a_local.frac._4_1_;
    local_10._0_4_ = (int)a_local.frac;
    local_10._5_1_ = a_local.frac._5_1_;
    local_10._6_2_ = a_local.frac._6_2_;
    a_local.exp = b_local.exp;
    a_local.cls = b_local.cls;
    a_local.sign = b_local.sign;
    a_local._14_2_ = b_local._14_2_;
  }
  else {
    _Var2 = is_nan(a_local.frac._4_1_);
    if ((_Var2) || (_Var2 = is_nan(b_local.frac._4_1_), _Var2)) {
      a_00.exp = (int)a_local.frac;
      a_00.frac._0_4_ = b_local.exp;
      a_00.frac._4_1_ = b_local.cls;
      a_00.frac._5_1_ = b_local.sign;
      a_00.frac._6_2_ = b_local._14_2_;
      a_00.cls = a_local.frac._4_1_;
      a_00.sign = a_local.frac._5_1_;
      a_00._14_2_ = a_local.frac._6_2_;
      b_00.exp = (int)b_local.frac;
      b_00.frac = _uStack_38;
      b_00.cls = b_local.frac._4_1_;
      b_00.sign = (_Bool)b_local.frac._5_1_;
      b_00._14_2_ = b_local.frac._6_2_;
      join_0x00000010_0x00000000_ = pick_nan(a_00,b_00,s);
    }
    else if (a_local.frac._4_1_ == float_class_inf) {
      if (b_local.frac._4_1_ == float_class_inf) {
        float_raise_tricore('\x01',s);
        join_0x00000010_0x00000000_ = parts_default_nan(s);
      }
      else {
        local_10._0_4_ = (int)uVar1;
        local_10._4_1_ = (char)((ulong)uVar1 >> 0x20);
        local_10._5_1_ = (bool)(char)((ulong)uVar1 >> 0x28);
        local_10._6_2_ = (short)((ulong)uVar1 >> 0x30);
        a_local.exp = b_local.exp;
        a_local.cls = b_local.cls;
        a_local.sign = b_local.sign;
        a_local._14_2_ = b_local._14_2_;
      }
    }
    else if ((a_local.frac._4_1_ == float_class_zero) && (b_local.frac._4_1_ == float_class_zero)) {
      local_10._5_1_ = s->float_rounding_mode == '\x01';
      local_10._0_4_ = (int)a._8_5_;
      local_10._4_1_ = (char)((uint5)a._8_5_ >> 0x20);
      local_10._6_2_ = a_local.frac._6_2_;
      a_local.exp = b_local.exp;
      a_local.cls = b_local.cls;
      a_local.sign = b_local.sign;
      a_local._14_2_ = b_local._14_2_;
    }
    else if ((a_local.frac._4_1_ == float_class_zero) || (b_local.frac._4_1_ == float_class_inf)) {
      local_10._4_1_ = b_local.frac._4_1_;
      local_10._0_4_ = (int)b_local.frac;
      local_10._5_1_ = local_49 != true;
      local_10._6_2_ = b_local.frac._6_2_;
      a_local.exp = uStack_38;
      a_local.cls = uStack_34;
      a_local.sign = (_Bool)uStack_33;
      a_local._14_2_ = uStack_32;
    }
    else {
      if (b_local.frac._4_1_ != float_class_zero) goto LAB_012b4c58;
      local_10._0_4_ = (int)uVar1;
      local_10._4_1_ = (char)((ulong)uVar1 >> 0x20);
      local_10._5_1_ = (bool)(char)((ulong)uVar1 >> 0x28);
      local_10._6_2_ = (short)((ulong)uVar1 >> 0x30);
      a_local.exp = b_local.exp;
      a_local.cls = b_local.cls;
      a_local.sign = b_local.sign;
      a_local._14_2_ = b_local._14_2_;
    }
  }
  return stack0xffffffffffffffe8;
}

Assistant:

static FloatParts addsub_floats(FloatParts a, FloatParts b, bool subtract,
                                float_status *s)
{
    bool a_sign = a.sign;
    bool b_sign = b.sign ^ subtract;

    if (a_sign != b_sign) {
        /* Subtraction */

        if (a.cls == float_class_normal && b.cls == float_class_normal) {
            if (a.exp > b.exp || (a.exp == b.exp && a.frac >= b.frac)) {
                shift64RightJamming(b.frac, a.exp - b.exp, &b.frac);
                a.frac = a.frac - b.frac;
            } else {
                shift64RightJamming(a.frac, b.exp - a.exp, &a.frac);
                a.frac = b.frac - a.frac;
                a.exp = b.exp;
                a_sign ^= 1;
            }

            if (a.frac == 0) {
                a.cls = float_class_zero;
                a.sign = s->float_rounding_mode == float_round_down;
            } else {
                int shift = clz64(a.frac) - 1;
                a.frac = a.frac << shift;
                a.exp = a.exp - shift;
                a.sign = a_sign;
            }
            return a;
        }
        if (is_nan(a.cls) || is_nan(b.cls)) {
            return pick_nan(a, b, s);
        }
        if (a.cls == float_class_inf) {
            if (b.cls == float_class_inf) {
                float_raise(float_flag_invalid, s);
                return parts_default_nan(s);
            }
            return a;
        }
        if (a.cls == float_class_zero && b.cls == float_class_zero) {
            a.sign = s->float_rounding_mode == float_round_down;
            return a;
        }
        if (a.cls == float_class_zero || b.cls == float_class_inf) {
            b.sign = a_sign ^ 1;
            return b;
        }
        if (b.cls == float_class_zero) {
            return a;
        }
    } else {
        /* Addition */
        if (a.cls == float_class_normal && b.cls == float_class_normal) {
            if (a.exp > b.exp) {
                shift64RightJamming(b.frac, a.exp - b.exp, &b.frac);
            } else if (a.exp < b.exp) {
                shift64RightJamming(a.frac, b.exp - a.exp, &a.frac);
                a.exp = b.exp;
            }
            a.frac += b.frac;
            if (a.frac & DECOMPOSED_OVERFLOW_BIT) {
                shift64RightJamming(a.frac, 1, &a.frac);
                a.exp += 1;
            }
            return a;
        }
        if (is_nan(a.cls) || is_nan(b.cls)) {
            return pick_nan(a, b, s);
        }
        if (a.cls == float_class_inf || b.cls == float_class_zero) {
            return a;
        }
        if (b.cls == float_class_inf || a.cls == float_class_zero) {
            b.sign = b_sign;
            return b;
        }
    }

    g_assert_not_reached();
    return a;
}